

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmat.c
# Opt level: O3

int32 tmat_chk_uppertri(tmat_t *tmat)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if ((long)tmat->n_tmat < 1) {
    return 0;
  }
  uVar1 = tmat->n_state;
  lVar2 = 0;
  do {
    if (0 < (int)uVar1) {
      lVar4 = 0;
      uVar3 = (ulong)uVar1;
      uVar5 = 0;
      do {
        uVar6 = uVar5 + 1;
        if ((long)uVar6 < (long)(int)uVar1) {
          uVar7 = 1;
          do {
            if (-0x38000000 <
                *(int *)(*(long *)((long)tmat->tp[lVar2] + uVar7 * 8 + lVar4) + uVar5 * 4)) {
              return -1;
            }
            uVar7 = uVar7 + 1;
          } while (uVar3 != uVar7);
        }
        lVar4 = lVar4 + 8;
        uVar3 = uVar3 - 1;
        uVar5 = uVar6;
      } while (uVar6 != uVar1);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != tmat->n_tmat);
  return 0;
}

Assistant:

int32
tmat_chk_uppertri(tmat_t * tmat)
{
    int32 i, src, dst;

    /* Check that each tmat is upper-triangular */
    for (i = 0; i < tmat->n_tmat; i++) {
        for (dst = 0; dst < tmat->n_state; dst++)
            for (src = dst + 1; src < tmat->n_state; src++)
                if (tmat->tp[i][src][dst] > S3_LOGPROB_ZERO)
                    return -1;
    }

    return 0;
}